

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O2

Error __thiscall
asmjit::v1_14::ZoneVector<asmjit::v1_14::RAWorkReg_*>::concat
          (ZoneVector<asmjit::v1_14::RAWorkReg_*> *this,ZoneAllocator *allocator,
          ZoneVector<asmjit::v1_14::RAWorkReg_*> *other)

{
  uint n;
  Error EVar1;
  uint uVar2;
  
  n = *(uint *)(other + 8);
  uVar2 = *(uint *)(this + 8);
  if (*(int *)(this + 0xc) - uVar2 < n) {
    EVar1 = grow(this,allocator,n);
    if (EVar1 != 0) {
      return EVar1;
    }
    uVar2 = *(uint *)(this + 8);
  }
  else if ((ulong)n == 0) {
    return 0;
  }
  memcpy((void *)((ulong)uVar2 * 8 + *(long *)this),*(void **)other,(ulong)n << 3);
  *(uint *)(this + 8) = *(int *)(this + 8) + n;
  return 0;
}

Assistant:

ASMJIT_FORCE_INLINE Error concat(ZoneAllocator* allocator, const ZoneVector<T>& other) noexcept {
    uint32_t size = other._size;
    if (_capacity - _size < size)
      ASMJIT_PROPAGATE(grow(allocator, size));

    if (size) {
      memcpy(static_cast<void*>(static_cast<T*>(_data) + _size),
             static_cast<const void*>(other._data),
             size_t(size) * sizeof(T));
      _size += size;
    }

    return kErrorOk;
  }